

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O1

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  gdImagePtr im_00;
  gdImagePtr dst;
  gdImagePtr im_01;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  double dVar19;
  int brect [8];
  
  dVar19 = points * 4.0;
  pcVar6 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,bottom);
  iVar7 = brect[7];
  iVar4 = brect[5];
  iVar9 = brect[3];
  iVar15 = brect[1];
  if (pcVar6 == (char *)0x0) {
    iVar14 = brect[6];
    if (brect[6] < brect[4]) {
      iVar14 = brect[4];
    }
    iVar12 = brect[6];
    if (brect[4] < brect[6]) {
      iVar12 = brect[4];
    }
    iVar17 = brect[2];
    if (brect[2] < brect[0]) {
      iVar17 = brect[0];
    }
    iVar1 = brect[2];
    if (brect[0] < brect[2]) {
      iVar1 = brect[0];
    }
    if (iVar17 <= iVar14) {
      iVar17 = iVar14;
    }
    if (iVar12 <= iVar1) {
      iVar1 = iVar12;
    }
    pcVar6 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,top);
    if (pcVar6 == (char *)0x0) {
      uVar8 = iVar17 - iVar1;
      iVar14 = iVar7;
      if (iVar7 < iVar4) {
        iVar14 = iVar4;
      }
      if (iVar4 < iVar7) {
        iVar7 = iVar4;
      }
      iVar4 = iVar9;
      if (iVar9 < iVar15) {
        iVar4 = iVar15;
      }
      if (iVar15 < iVar9) {
        iVar9 = iVar15;
      }
      if (iVar4 <= iVar14) {
        iVar4 = iVar14;
      }
      if (iVar7 <= iVar9) {
        iVar9 = iVar7;
      }
      iVar7 = brect[6];
      if (brect[6] < brect[4]) {
        iVar7 = brect[4];
      }
      if (brect[4] < brect[6]) {
        brect[6] = brect[4];
      }
      iVar15 = brect[2];
      if (brect[2] < brect[0]) {
        iVar15 = brect[0];
      }
      if (brect[0] < brect[2]) {
        brect[2] = brect[0];
      }
      if (iVar15 <= iVar7) {
        iVar15 = iVar7;
      }
      if (brect[6] <= brect[2]) {
        brect[2] = brect[6];
      }
      uVar18 = iVar15 - brect[2];
      iVar7 = brect[7];
      if (brect[7] < brect[5]) {
        iVar7 = brect[5];
      }
      if (brect[5] < brect[7]) {
        brect[7] = brect[5];
      }
      iVar15 = brect[3];
      if (brect[3] < brect[1]) {
        iVar15 = brect[1];
      }
      if (brect[1] < brect[3]) {
        brect[3] = brect[1];
      }
      if (iVar15 <= iVar7) {
        iVar15 = iVar7;
      }
      if (brect[7] <= brect[3]) {
        brect[3] = brect[7];
      }
      iVar7 = uVar18 + 6;
      if ((int)uVar18 < (int)uVar8) {
        iVar7 = uVar8 + 6;
      }
      iVar14 = iVar7 * 2 + 4;
      uVar5 = iVar15 - brect[3];
      if (iVar15 - brect[3] < iVar4 - iVar9) {
        uVar5 = iVar4 - iVar9;
      }
      iVar9 = uVar5 + 6;
      im_00 = gdImageCreateTrueColor(iVar14,iVar9);
      if (im_00 == (gdImagePtr)0x0) {
        pcVar6 = "could not create first image";
      }
      else {
        iVar15 = iVar14 >> 1;
        pcVar6 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                 (int)(iVar15 - (uVar8 + 6)) / 2,(int)dVar19,bottom);
        if ((pcVar6 == (char *)0x0) &&
           (pcVar6 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                     (int)(iVar15 - (uVar18 + 6)) / 2 + iVar15,(int)dVar19,top),
           pcVar6 == (char *)0x0)) {
          iVar4 = iVar7 * 2;
          if ((uVar5 & 1) == 0) {
            if (0 < iVar9 >> 1) {
              if ((int)uVar8 < (int)uVar18) {
                uVar8 = uVar18;
              }
              uVar10 = 0;
              do {
                if (SBORROW4(iVar15,iVar4) != iVar15 + iVar7 * -2 < 0) {
                  piVar2 = im_00->tpixels[(int)(~(uint)uVar10 + iVar9)];
                  piVar3 = im_00->tpixels[uVar10];
                  lVar13 = ((long)((ulong)(uVar8 + 8) << 0x21) >> 0x21) + 1;
                  iVar12 = ((iVar15 + uVar8 * 2) - ((int)(uVar8 * 2 + 0x10) >> 1)) + 0xe;
                  do {
                    iVar17 = piVar2[(long)iVar12 + -1];
                    piVar2[(long)iVar12 + -1] = piVar3[lVar13 + 1];
                    piVar3[lVar13 + 1] = iVar17;
                    lVar13 = lVar13 + 1;
                    iVar12 = iVar12 + -1;
                  } while (lVar13 <= iVar4);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != (uint)(iVar9 >> 1));
            }
          }
          else if (-8 < (int)uVar5) {
            uVar5 = iVar9 / 2;
            uVar10 = (ulong)uVar5;
            iVar7 = iVar7 * 2 + 7;
            if (-1 < iVar14) {
              iVar7 = iVar14;
            }
            if ((int)uVar8 < (int)uVar18) {
              uVar8 = uVar18;
            }
            uVar11 = 0;
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            do {
              iVar12 = 0;
              if (uVar11 == uVar10) {
                iVar12 = -(iVar7 >> 2);
              }
              iVar12 = iVar12 + iVar4 + 2;
              if (iVar15 + 2 < iVar12) {
                piVar2 = im_00->tpixels[(int)(~(uint)uVar11 + iVar9)];
                piVar3 = im_00->tpixels[uVar11];
                lVar13 = ((long)(((ulong)uVar8 << 0x21) + 0x1000000000) >> 0x21) + 2;
                iVar17 = ((iVar15 + uVar8 * 2) - ((int)(uVar8 * 2 + 0x10) >> 1)) + 0xe;
                do {
                  iVar1 = piVar2[(long)iVar17 + -1];
                  piVar2[(long)iVar17 + -1] = piVar3[lVar13];
                  piVar3[lVar13] = iVar1;
                  lVar13 = lVar13 + 1;
                  iVar17 = iVar17 + -1;
                } while (lVar13 < iVar12);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar5 + 1);
          }
          iVar9 = iVar9 * 10;
          if (iVar14 <= iVar9) {
            iVar14 = iVar9;
          }
          dst = gdImageCreateTrueColor(iVar14,iVar14);
          if (dst == (gdImagePtr)0x0) {
            gdImageDestroy(im_00);
            pcVar6 = "could not create resampled image";
          }
          else {
            iVar15 = (int)((1.0 - textRadius / radius) * (double)iVar9);
            iVar7 = (int)((textRadius / radius) * (double)iVar9);
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * (double)dst->sx * 0.25),iVar15,0,0,
                       (int)((double)dst->sx * fillPortion * 0.5),iVar7,im_00->sx / 2,im_00->sy);
            dVar19 = (double)dst->sx;
            iVar9 = im_00->sx / 2;
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * dVar19 * 0.25 + (double)(dst->sx / 2)),
                       iVar15,iVar9,0,(int)(dVar19 * fillPortion * 0.5),iVar7,iVar9,im_00->sy);
            im_01 = gdImageSquareToCircle(dst,(int)radius);
            gdImageDestroy(im_00);
            gdImageDestroy(dst);
            uVar8 = im_01->sy;
            if (0 < (int)uVar8) {
              iVar7 = im_01->sx;
              lVar13 = 0;
              do {
                if (0 < im_01->sx) {
                  lVar16 = 0;
                  do {
                    gdImageSetPixel(im,(cx - iVar7 / 2) + (int)lVar16,
                                    (cy - (uVar8 >> 1)) + (int)lVar13,
                                    (fgcolor & 0xffffffU | 0x7f000000) +
                                    ((((uint)im_01->tpixels[lVar13][lVar16] >> 0x11 & 0x7f) *
                                     ((uint)~fgcolor >> 0x18 & 0x7f)) / 0x7f) * -0x1000000);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < im_01->sx);
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < im_01->sy);
            }
            gdImageDestroy(im_01);
            pcVar6 = (char *)0x0;
          }
        }
        else {
          gdImageDestroy(im_00);
        }
      }
    }
  }
  return pcVar6;
}

Assistant:

BGD_DECLARE(char *)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	gdImageDestroy (im1);
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}